

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O0

void Abc_ObjAddFanin(Abc_Obj_t *pObj,Abc_Obj_t *pFanin)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pFaninR;
  Abc_Obj_t *pFanin_local;
  Abc_Obj_t *pObj_local;
  
  pObj_00 = Abc_ObjRegular(pFanin);
  iVar1 = Abc_ObjIsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                  ,0x57,"void Abc_ObjAddFanin(Abc_Obj_t *, Abc_Obj_t *)");
  }
  if (pObj->pNtk == pObj_00->pNtk) {
    if ((-1 < pObj->Id) && (-1 < pObj_00->Id)) {
      iVar1 = Abc_ObjIsPi(pObj);
      if (iVar1 == 0) {
        iVar1 = Abc_ObjIsPo(pObj_00);
        if (iVar1 == 0) {
          iVar1 = Abc_ObjIsCo(pObj);
          if (iVar1 != 0) {
            iVar1 = Abc_ObjFaninNum(pObj);
            if (iVar1 != 0) {
              __assert_fail("!Abc_ObjIsCo(pObj) || !Abc_ObjFaninNum(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                            ,0x5b,"void Abc_ObjAddFanin(Abc_Obj_t *, Abc_Obj_t *)");
            }
          }
          iVar1 = Abc_ObjIsNet(pObj);
          if (iVar1 != 0) {
            iVar1 = Abc_ObjFaninNum(pObj);
            if (iVar1 != 0) {
              __assert_fail("!Abc_ObjIsNet(pObj) || !Abc_ObjFaninNum(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                            ,0x5c,"void Abc_ObjAddFanin(Abc_Obj_t *, Abc_Obj_t *)");
            }
          }
          Vec_IntPushMem(pObj->pNtk->pMmStep,&pObj->vFanins,pObj_00->Id);
          Vec_IntPushMem(pObj->pNtk->pMmStep,&pObj_00->vFanouts,pObj->Id);
          iVar1 = Abc_ObjIsComplement(pFanin);
          if (iVar1 != 0) {
            iVar1 = Abc_ObjFaninNum(pObj);
            Abc_ObjSetFaninC(pObj,iVar1 + -1);
          }
          return;
        }
      }
      __assert_fail("!Abc_ObjIsPi(pObj) && !Abc_ObjIsPo(pFaninR)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                    ,0x5a,"void Abc_ObjAddFanin(Abc_Obj_t *, Abc_Obj_t *)");
    }
    __assert_fail("pObj->Id >= 0 && pFaninR->Id >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                  ,0x59,"void Abc_ObjAddFanin(Abc_Obj_t *, Abc_Obj_t *)");
  }
  __assert_fail("pObj->pNtk == pFaninR->pNtk",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanio.c"
                ,0x58,"void Abc_ObjAddFanin(Abc_Obj_t *, Abc_Obj_t *)");
}

Assistant:

void Abc_ObjAddFanin( Abc_Obj_t * pObj, Abc_Obj_t * pFanin )
{
    Abc_Obj_t * pFaninR = Abc_ObjRegular(pFanin);
    assert( !Abc_ObjIsComplement(pObj) );
    assert( pObj->pNtk == pFaninR->pNtk );
    assert( pObj->Id >= 0 && pFaninR->Id >= 0 );
    assert( !Abc_ObjIsPi(pObj) && !Abc_ObjIsPo(pFaninR) );    // fanin of PI or fanout of PO
    assert( !Abc_ObjIsCo(pObj) || !Abc_ObjFaninNum(pObj) );  // CO with two fanins
    assert( !Abc_ObjIsNet(pObj) || !Abc_ObjFaninNum(pObj) ); // net with two fanins
    Vec_IntPushMem( pObj->pNtk->pMmStep, &pObj->vFanins,     pFaninR->Id );
    Vec_IntPushMem( pObj->pNtk->pMmStep, &pFaninR->vFanouts, pObj->Id    );
    if ( Abc_ObjIsComplement(pFanin) )
        Abc_ObjSetFaninC( pObj, Abc_ObjFaninNum(pObj)-1 );
}